

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O1

optional<unsigned_long> __thiscall
absl::status_internal::FindPayloadIndexByUrl
          (status_internal *this,Payloads *payloads,string_view type_url)

{
  Payloads *__n;
  int iVar1;
  const_reference pVVar2;
  undefined8 unaff_RBX;
  ulong uVar3;
  _Storage<unsigned_long,_true> unaff_R14;
  bool bVar4;
  optional<unsigned_long> oVar5;
  
  if (this == (status_internal *)0x0) {
    uVar3 = 0;
  }
  else {
    bVar4 = *(ulong *)this >= 2;
    if (*(ulong *)this < 2) {
      unaff_R14._M_value = 0;
    }
    else {
      unaff_R14._M_value = 0;
      do {
        pVVar2 = InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
                 ::operator[]((InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
                               *)this,unaff_R14._M_value);
        __n = (Payloads *)(pVVar2->type_url)._M_string_length;
        if ((__n == payloads) &&
           ((__n == (Payloads *)0x0 ||
            (iVar1 = bcmp((pVVar2->type_url)._M_dataplus._M_p,(void *)type_url._M_len,(size_t)__n),
            iVar1 == 0)))) break;
        unaff_R14._M_value = unaff_R14._M_value + 1;
        bVar4 = unaff_R14._M_value < *(ulong *)this >> 1;
      } while (bVar4);
    }
    uVar3 = CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar4);
  }
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar3 & 0xffffffff;
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_R14._M_value;
  return (optional<unsigned_long>)
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

static absl::optional<size_t> FindPayloadIndexByUrl(
    const Payloads* payloads, absl::string_view type_url) {
  if (payloads == nullptr) return absl::nullopt;

  for (size_t i = 0; i < payloads->size(); ++i) {
    if ((*payloads)[i].type_url == type_url) return i;
  }

  return absl::nullopt;
}